

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O2

void __thiscall nv::FloatImage::normalize(FloatImage *this,uint base_component)

{
  float *pfVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint i;
  ulong uVar6;
  float local_58;
  float local_54;
  float local_50;
  Vector3 local_4c;
  Vector3 local_40;
  
  if (this->m_componentNum < base_component + 3) {
    iVar2 = nvAbort("base_component + 3 <= m_componentNum",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/FloatImage.cpp"
                    ,0xaa,"void nv::FloatImage::normalize(uint)");
    if (iVar2 == 1) {
      raise(5);
    }
  }
  pfVar1 = this->m_mem;
  uVar5 = (uint)this->m_height * (uint)this->m_width;
  uVar3 = (base_component + 1) * uVar5;
  uVar4 = (base_component + 2) * uVar5;
  for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    local_4c.m_x = pfVar1[uVar5 * base_component + uVar6];
    local_4c.m_y = pfVar1[uVar3 + uVar6];
    local_4c.m_z = pfVar1[uVar4 + uVar6];
    local_40.m_x = 0.0;
    local_40.m_y = 0.0;
    local_40.m_z = 0.0;
    normalizeSafe((nv *)&local_58,&local_4c,&local_40,0.0);
    pfVar1[uVar5 * base_component + uVar6] = local_58;
    pfVar1[uVar3 + uVar6] = local_54;
    pfVar1[uVar4 + uVar6] = local_50;
  }
  return;
}

Assistant:

void FloatImage::normalize(uint base_component)
{
	nvCheck(base_component + 3 <= m_componentNum);
	
	float * xChannel = this->channel(base_component + 0);
	float * yChannel = this->channel(base_component + 1);
	float * zChannel = this->channel(base_component + 2);

	const uint size = m_width * m_height;
	for(uint i = 0; i < size; i++) {
		
		Vector3 normal(xChannel[i], yChannel[i], zChannel[i]);
		normal = normalizeSafe(normal, Vector3(zero), 0.0f);
		
		xChannel[i] = normal.x();
		yChannel[i] = normal.y();
		zChannel[i] = normal.z();
	}
}